

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

pcut_item_t * pcut_find_by_id(pcut_item_t *first,int id)

{
  pcut_item_t *item;
  
  item = pcut_get_real(first);
  while( true ) {
    if (item == (pcut_item_t *)0x0) {
      return (pcut_item_t *)0x0;
    }
    if (item->id == id) break;
    item = pcut_get_real_next(item);
  }
  return item;
}

Assistant:

static pcut_item_t *pcut_find_by_id(pcut_item_t *first, int id) {
	pcut_item_t *it = pcut_get_real(first);
	while (it != NULL) {
		if (it->id == id) {
			return it;
		}
		it = pcut_get_real_next(it);
	}
	return NULL;
}